

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[9],std::__cxx11::string&,wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [9],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u,Newline *args)

{
  size_t size;
  
  size = strlen(*t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*t,size);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,(u->_M_dataplus)._M_p,u->_M_string_length);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }